

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall cppcms::application::add_context(application *this,context *conn)

{
  application *paVar1;
  runtime_error *this_00;
  string local_40;
  
  paVar1 = this->root_;
  if (paVar1 != paVar1->root_) {
    do {
      paVar1 = paVar1->root_;
      this->root_ = paVar1;
    } while (paVar1->root_ != paVar1);
  }
  if ((((paVar1->d).ptr_)->conn).
      super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    paVar1 = this->root_;
    if (paVar1 != paVar1->root_) {
      do {
        paVar1 = paVar1->root_;
        this->root_ = paVar1;
      } while (paVar1->root_ != paVar1);
    }
    ((paVar1->d).ptr_)->temp_conn = conn;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Context already assigned","")
  ;
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00287810;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}